

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

int jas_image_fmtfromname(char *name)

{
  int iVar1;
  char *pcVar2;
  jas_image_fmtinfo_t *local_30;
  jas_image_fmtinfo_t *fmtinfo;
  char *ext;
  int i;
  char *name_local;
  
  pcVar2 = strrchr(name,0x2e);
  if (pcVar2 != (char *)0x0) {
    local_30 = jas_image_fmtinfos;
    for (ext._4_4_ = 0; ext._4_4_ < jas_image_numfmts; ext._4_4_ = ext._4_4_ + 1) {
      iVar1 = strcmp(pcVar2 + 1,local_30->ext);
      if (iVar1 == 0) {
        return local_30->id;
      }
      local_30 = local_30 + 1;
    }
  }
  return -1;
}

Assistant:

int jas_image_fmtfromname(const char *name)
{
	int i;
	const char *ext;
	const jas_image_fmtinfo_t *fmtinfo;
	/* Get the file name extension. */
	if (!(ext = strrchr(name, '.'))) {
		return -1;
	}
	++ext;
	/* Try to find a format that uses this extension. */	
	for (i = 0, fmtinfo = jas_image_fmtinfos; i < jas_image_numfmts; ++i,
	  ++fmtinfo) {
		/* Do we have a match? */
		if (!strcmp(ext, fmtinfo->ext)) {
			return fmtinfo->id;
		}
	}
	return -1;
}